

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::TextureBindingTestCase::test
          (TextureBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  allocator<char> local_dd;
  GLuint texture;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  code *local_38;
  GLenum local_30;
  
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,*(GLenum *)&(this->super_BindingTest).field_0x7c,0,
             (this->super_BindingTest).m_type);
  texture = 0;
  glu::CallLogWrapper::glGenTextures(gl,1,&texture);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glGenTextures");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  glu::CallLogWrapper::glBindTexture(gl,this->m_textureType,texture);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glBindTexture");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,*(GLenum *)&(this->super_BindingTest).field_0x7c,texture,
             (this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteTextures(gl,1,&texture);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glDeleteTextures");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,*(GLenum *)&(this->super_BindingTest).field_0x7c,0,
             (this->super_BindingTest).m_type);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		verifyStateInteger(result, gl, m_testBindingName, 0, m_type);

		GLuint texture = 0;
		gl.glGenTextures(1, &texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenTextures");

		gl.glBindTexture(m_textureType, texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		verifyStateInteger(result, gl, m_testBindingName, texture, m_type);

		gl.glDeleteTextures(1, &texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");

		verifyStateInteger(result, gl, m_testBindingName, 0, m_type);
	}